

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O0

TokenType __thiscall TokenScanner::getTokenType(TokenScanner *this,string *token)

{
  char ch_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  char ch;
  string *token_local;
  TokenScanner *this_local;
  
  bVar1 = std::operator==(token,"");
  if (bVar1) {
    return ~SEPARATOR;
  }
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)token);
  ch_00 = *pcVar3;
  iVar2 = isspace((int)ch_00);
  if (iVar2 == 0) {
    if ((ch_00 == '\"') || ((ch_00 == '\'' && (uVar4 = std::__cxx11::string::length(), 1 < uVar4))))
    {
      this_local._4_4_ = STRING;
    }
    else {
      iVar2 = isdigit((int)ch_00);
      if (iVar2 == 0) {
        bVar1 = isWordCharacter(this,ch_00);
        if (bVar1) {
          this_local._4_4_ = WORD;
        }
        else {
          this_local._4_4_ = OPERATOR;
        }
      }
      else {
        this_local._4_4_ = NUMBER;
      }
    }
    return this_local._4_4_;
  }
  return SEPARATOR;
}

Assistant:

TokenType TokenScanner::getTokenType(string token) const {
   if (token == "") return TokenType(EOF);
   char ch = token[0];
   if (isspace(ch)) return SEPARATOR;
   if (ch == '"' || (ch == '\'' && token.length() > 1)) return STRING;
   if (isdigit(ch)) return NUMBER;
   if (isWordCharacter(ch)) return WORD;
   return OPERATOR;
}